

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockContextInitialize(ImGuiContext *ctx)

{
  int *piVar1;
  ImGuiSettingsHandler *pIVar2;
  ImU32 IVar3;
  int iVar4;
  ImGuiSettingsHandler *__dest;
  int iVar5;
  int iVar6;
  
  IVar3 = ImHashStr("Docking",0,0);
  iVar4 = (ctx->SettingsHandlers).Size;
  if (iVar4 == (ctx->SettingsHandlers).Capacity) {
    if (iVar4 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar4 / 2 + iVar4;
    }
    iVar6 = iVar4 + 1;
    if (iVar4 + 1 < iVar5) {
      iVar6 = iVar5;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (ImGuiSettingsHandler *)
             (*GImAllocatorAllocFunc)((long)iVar6 * 0x48,GImAllocatorUserData);
    pIVar2 = (ctx->SettingsHandlers).Data;
    if (pIVar2 != (ImGuiSettingsHandler *)0x0) {
      memcpy(__dest,pIVar2,(long)(ctx->SettingsHandlers).Size * 0x48);
      pIVar2 = (ctx->SettingsHandlers).Data;
      if ((pIVar2 != (ImGuiSettingsHandler *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    }
    (ctx->SettingsHandlers).Data = __dest;
    (ctx->SettingsHandlers).Capacity = iVar6;
    iVar4 = (ctx->SettingsHandlers).Size;
  }
  else {
    __dest = (ctx->SettingsHandlers).Data;
  }
  __dest[iVar4].TypeName = "Docking";
  __dest[iVar4].TypeHash = IVar3;
  *(undefined4 *)&__dest[iVar4].field_0xc = 0;
  __dest[iVar4].ClearAllFn = DockSettingsHandler_ClearAll;
  __dest[iVar4].ReadInitFn = DockSettingsHandler_ClearAll;
  __dest[iVar4].ReadOpenFn = DockSettingsHandler_ReadOpen;
  __dest[iVar4].ReadLineFn = DockSettingsHandler_ReadLine;
  __dest[iVar4].ApplyAllFn = DockSettingsHandler_ApplyAll;
  __dest[iVar4].WriteAllFn = DockSettingsHandler_WriteAll;
  __dest[iVar4].UserData = (void *)0x0;
  (ctx->SettingsHandlers).Size = (ctx->SettingsHandlers).Size + 1;
  return;
}

Assistant:

void ImGui::DockContextInitialize(ImGuiContext* ctx)
{
    ImGuiContext& g = *ctx;

    // Add .ini handle for persistent docking data
    ImGuiSettingsHandler ini_handler;
    ini_handler.TypeName = "Docking";
    ini_handler.TypeHash = ImHashStr("Docking");
    ini_handler.ClearAllFn = DockSettingsHandler_ClearAll;
    ini_handler.ReadInitFn = DockSettingsHandler_ClearAll; // Also clear on read
    ini_handler.ReadOpenFn = DockSettingsHandler_ReadOpen;
    ini_handler.ReadLineFn = DockSettingsHandler_ReadLine;
    ini_handler.ApplyAllFn = DockSettingsHandler_ApplyAll;
    ini_handler.WriteAllFn = DockSettingsHandler_WriteAll;
    g.SettingsHandlers.push_back(ini_handler);
}